

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_parsecfg.c
# Opt level: O0

char * my_get_line(FILE *fp)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t linelen;
  char *ptr;
  char *line;
  char *nl;
  char buf [4096];
  FILE *fp_local;
  
  line = (char *)0x0;
  ptr = (char *)0x0;
  buf._4088_8_ = fp;
  do {
    pcVar1 = fgets((char *)&nl,0x1000,(FILE *)buf._4088_8_);
    if (pcVar1 == (char *)0x0) break;
    if (ptr == (char *)0x0) {
      ptr = strdup((char *)&nl);
      if (ptr == (char *)0x0) {
        return (char *)0x0;
      }
    }
    else {
      sVar2 = strlen(ptr);
      sVar3 = strlen((char *)&nl);
      pcVar1 = (char *)realloc(ptr,sVar2 + sVar3 + 1);
      if (pcVar1 == (char *)0x0) {
        free(ptr);
        return (char *)0x0;
      }
      strcpy(pcVar1 + sVar2,(char *)&nl);
      ptr = pcVar1;
    }
    line = strchr(ptr,10);
  } while (line == (char *)0x0);
  if (line != (char *)0x0) {
    *line = '\0';
  }
  return ptr;
}

Assistant:

static char *my_get_line(FILE *fp)
{
  char buf[4096];
  char *nl = NULL;
  char *line = NULL;

  do {
    if(NULL == fgets(buf, sizeof(buf), fp))
      break;
    if(!line) {
      line = strdup(buf);
      if(!line)
        return NULL;
    }
    else {
      char *ptr;
      size_t linelen = strlen(line);
      ptr = realloc(line, linelen + strlen(buf) + 1);
      if(!ptr) {
        Curl_safefree(line);
        return NULL;
      }
      line = ptr;
      strcpy(&line[linelen], buf);
    }
    nl = strchr(line, '\n');
  } while(!nl);

  if(nl)
    *nl = '\0';

  return line;
}